

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_tweak_add(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *tweak32)

{
  int iVar1;
  long in_RDX;
  void *in_RSI;
  int ret;
  secp256k1_ge p;
  secp256k1_ge *in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff80;
  uint uVar2;
  byte bVar3;
  secp256k1_context *in_stack_ffffffffffffff88;
  uchar *in_stack_ffffffffffffff98;
  secp256k1_ge *in_stack_ffffffffffffffa0;
  undefined4 local_4;
  
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)(ulong)in_stack_ffffffffffffff80,
               (char *)in_stack_ffffffffffffff78);
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)(ulong)in_stack_ffffffffffffff80,
               (char *)in_stack_ffffffffffffff78);
    local_4 = 0;
  }
  else {
    iVar1 = secp256k1_pubkey_load
                      (in_stack_ffffffffffffff88,(secp256k1_ge *)(ulong)in_stack_ffffffffffffff80,
                       (secp256k1_pubkey *)in_stack_ffffffffffffff78);
    memset(in_RSI,0,0x40);
    uVar2 = in_stack_ffffffffffffff80 & 0xffffff;
    if (iVar1 != 0) {
      iVar1 = secp256k1_ec_pubkey_tweak_add_helper
                        (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      uVar2 = CONCAT13(iVar1 != 0,(int3)uVar2);
    }
    bVar3 = (byte)(uVar2 >> 0x18);
    local_4 = (uint)bVar3;
    if (local_4 != 0) {
      secp256k1_pubkey_save
                ((secp256k1_pubkey *)(ulong)CONCAT14(bVar3,uVar2),in_stack_ffffffffffffff78);
    }
  }
  return local_4;
}

Assistant:

int secp256k1_ec_pubkey_tweak_add(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const unsigned char *tweak32) {
    secp256k1_ge p;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(tweak32 != NULL);

    ret = secp256k1_pubkey_load(ctx, &p, pubkey);
    memset(pubkey, 0, sizeof(*pubkey));
    ret = ret && secp256k1_ec_pubkey_tweak_add_helper(&p, tweak32);
    if (ret) {
        secp256k1_pubkey_save(pubkey, &p);
    }

    return ret;
}